

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.hpp
# Opt level: O3

size_t jessilib::find<char,char,false>
                 (basic_string_view<char,_std::char_traits<char>_> in_string,
                 basic_string_view<char,_std::char_traits<char>_> in_substring)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  char *pcVar5;
  char *pcVar6;
  jessilib *pjVar7;
  jessilib *extraout_RDX;
  jessilib *pjVar9;
  jessilib *pjVar10;
  jessilib *this;
  jessilib *this_00;
  decode_result dVar11;
  decode_result dVar12;
  basic_string_view<char,_std::char_traits<char>_> in_string_00;
  basic_string_view<char,_std::char_traits<char>_> in_string_01;
  basic_string_view<char,_std::char_traits<char>_> in_string_02;
  char *local_60;
  jessilib *pjVar8;
  
  in_string_00._M_len = in_string._M_str;
  this = (jessilib *)in_string._M_len;
  pcVar6 = in_substring._M_str;
  pjVar7 = (jessilib *)in_substring._M_len;
  if (pjVar7 == (jessilib *)0x0) {
    pcVar3 = (char *)0x0;
  }
  else {
    pcVar3 = (char *)0xffffffffffffffff;
    if (this != (jessilib *)0x0) {
      if (pjVar7 == (jessilib *)0x1) {
        in_string_00._M_str._0_4_ = (int)*pcVar6;
        in_string_00._M_str._4_4_ = 0;
        sVar4 = find<char,false>(this,in_string_00,(char32_t)in_substring._M_str);
        return sVar4;
      }
      if (pjVar7 <= this) {
        pcVar5 = (char *)0x0;
        pjVar9 = pjVar7;
        this_00 = pjVar7;
        local_60 = pcVar6;
        pjVar10 = this;
        pcVar3 = in_string_00._M_len;
LAB_002996d3:
        do {
          in_string_01._M_str = (char *)pjVar9;
          in_string_01._M_len = (size_t)in_string_00._M_len;
          dVar11 = decode_codepoint_utf8<char>(this,in_string_01);
          in_string_02._M_str = (char *)dVar11.units;
          in_string_02._M_len = (size_t)local_60;
          dVar12 = decode_codepoint_utf8<char>(this_00,in_string_02);
          pjVar8 = (jessilib *)dVar12.units;
          if ((in_string_02._M_str == (char *)0x0) || (pjVar8 == (jessilib *)0x0)) break;
          pjVar9 = pjVar8;
          if (dVar11.codepoint == dVar12.codepoint) {
LAB_00299733:
            if (this_00 + -(long)pjVar8 == (jessilib *)0x0) {
              return (size_t)pcVar5;
            }
            in_string_00._M_len = in_string_00._M_len + (long)in_string_02._M_str;
            this = this + -(long)in_string_02._M_str;
            this_00 = this_00 + -(long)pjVar8;
            local_60 = local_60 + (long)pjVar8;
            if (this != (jessilib *)0x0) goto LAB_002996d3;
          }
          else {
            iVar1 = jessilib::fold(dVar11.codepoint);
            iVar2 = jessilib::fold(dVar12.codepoint);
            pjVar9 = extraout_RDX;
            if (iVar1 == iVar2) goto LAB_00299733;
          }
          in_string_00._M_len = pcVar3 + (long)in_string_02._M_str;
          this = pjVar10 + -(long)in_string_02._M_str;
          pcVar5 = pcVar5 + (long)in_string_02._M_str;
          pjVar9 = pjVar7;
          this_00 = pjVar7;
          local_60 = pcVar6;
          pjVar10 = this;
          pcVar3 = in_string_00._M_len;
        } while (pjVar7 <= this);
        pcVar3 = (char *)0xffffffffffffffff;
      }
    }
  }
  return (size_t)pcVar3;
}

Assistant:

std::pair<bool, std::string> ustring_to_mbstring(std::basic_string_view<CharT> in_string) {
	std::pair<bool, std::string> result;

	std::mbstate_t mbstate{};
	decode_result decode;
	while ((decode = decode_codepoint(in_string)).units != 0) {
		in_string.remove_prefix(decode.units);

		char buffer[MB_LEN_MAX]; // MB_LEN_MAX is constant, MB_CUR_MAX is not, and C++ doesn't have VLAs
		size_t bytes_written = std::c32rtomb(buffer, decode.codepoint, &mbstate);
		if (bytes_written > MB_LEN_MAX) {
			// Invalid codepoint; return
			result.first = false;
			return result;
		}

		result.second.append(buffer, bytes_written);
	}

	result.first = true;
	return result;
}